

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int locateInStringList(char *str,char **list,PHYSFS_uint32 *pos)

{
  PHYSFS_uint32 PVar1;
  int iVar2;
  int cmp;
  PHYSFS_uint32 middle;
  PHYSFS_uint32 lo;
  PHYSFS_uint32 half_len;
  PHYSFS_uint32 len;
  PHYSFS_uint32 *pos_local;
  char **list_local;
  char *str_local;
  
  cmp = 0;
  PVar1 = *pos;
  while( true ) {
    lo = PVar1;
    if (lo == 0) {
      *pos = cmp;
      return 0;
    }
    PVar1 = lo >> 1;
    iVar2 = strcmp(list[cmp + PVar1],str);
    if (iVar2 == 0) break;
    if (iVar2 < 1) {
      cmp = cmp + PVar1 + 1;
      PVar1 = lo - (PVar1 + 1);
    }
  }
  return 1;
}

Assistant:

static int locateInStringList(const char *str,
                              char **list,
                              PHYSFS_uint32 *pos)
{
    PHYSFS_uint32 len = *pos;
    PHYSFS_uint32 half_len;
    PHYSFS_uint32 lo = 0;
    PHYSFS_uint32 middle;
    int cmp;

    while (len > 0)
    {
        half_len = len >> 1;
        middle = lo + half_len;
        cmp = strcmp(list[middle], str);

        if (cmp == 0)  /* it's in the list already. */
            return 1;
        else if (cmp > 0)
            len = half_len;
        else
        {
            lo = middle + 1;
            len -= half_len + 1;
        } /* else */
    } /* while */

    *pos = lo;
    return 0;
}